

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O3

void __thiscall
t_ocaml_generator::generate_ocaml_struct_definition
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  int *piVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  ostream *poVar5;
  pointer pptVar6;
  string tname;
  char *local_b0;
  long local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  string local_90;
  char *local_70;
  long local_68;
  char local_60 [8];
  undefined8 uStack_58;
  string local_50;
  
  type_name_abi_cxx11_(&local_90,this,&tstruct->super_t_type);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"class ",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," =",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"object (self)",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish != pptVar6) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      generate_ocaml_struct_member(this,out,&local_50,*pptVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  generate_ocaml_method_copy(this,out,&tstruct->members_);
  generate_ocaml_struct_writer(this,out,tstruct);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"end",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (is_exception) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"exception ",10);
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    pcVar2 = local_b0;
    iVar4 = toupper((int)*local_b0);
    *pcVar2 = (char)iVar4;
    lVar3 = local_a8;
    if (local_b0 == local_a0) {
      uStack_58 = uStack_98;
      local_b0 = local_60;
    }
    local_68 = local_a8;
    local_a8 = 0;
    local_a0[0] = '\0';
    local_70 = local_b0;
    local_b0 = local_a0;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_70,lVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," of ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
  }
  generate_ocaml_struct_reader(this,out,tstruct);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_definition(ostream& out,
                                                         t_struct* tstruct,
                                                         bool is_exception) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  string tname = type_name(tstruct);
  indent(out) << "class " << tname << " =" << endl;
  indent(out) << "object (self)" << endl;

  indent_up();

  if (members.size() > 0) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      generate_ocaml_struct_member(out, tname, (*m_iter));
      out << endl;
    }
  }
  generate_ocaml_method_copy(out, members);
  generate_ocaml_struct_writer(out, tstruct);
  indent_down();
  indent(out) << "end" << endl;

  if (is_exception) {
    indent(out) << "exception " << capitalize(tname) << " of " << tname << endl;
  }

  generate_ocaml_struct_reader(out, tstruct);
}